

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_asr_8_r(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = m68ki_cpu.ir & 7;
  uVar2 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c)) & 0x3f;
  uVar1 = m68ki_cpu.dar[uVar3];
  m68ki_cpu.not_z_flag = uVar1 & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> ((byte)uVar2 & 0x1f);
  if ((ulong)uVar2 == 0) {
    m68ki_cpu._348_8_ = CONCAT44(uVar1,m68ki_cpu.x_flag) & 0xffffffffff;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    return;
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles - (uVar2 << ((byte)m68ki_cpu.cyc_shift & 0x1f));
  if (uVar2 < 8) {
    if ((char)uVar1 < '\0') {
      m68ki_cpu.n_flag = m68ki_cpu.n_flag | ""[uVar2];
    }
    m68ki_cpu.dar[uVar3] = uVar1 & 0xffffff00 | m68ki_cpu.n_flag;
    m68ki_cpu.c_flag = m68ki_cpu.not_z_flag << (9 - (byte)uVar2 & 0x1f);
    m68ki_cpu.x_flag = m68ki_cpu.c_flag;
    m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
    m68ki_cpu.v_flag = 0;
    return;
  }
  if (-1 < (char)uVar1) {
    m68ki_cpu.dar[uVar3] = uVar1 & 0xffffff00;
    m68ki_cpu.x_flag = 0;
    m68ki_cpu.n_flag = 0;
    m68ki_cpu.not_z_flag = 0;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    return;
  }
  m68ki_cpu.dar[uVar3] = uVar1 | 0xff;
  m68ki_cpu.c_flag = 0x100;
  m68ki_cpu.x_flag = 0x100;
  m68ki_cpu.n_flag = 0x80;
  m68ki_cpu.not_z_flag = 0xffffffff;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_asr_8_r(void)
{
	uint* r_dst = &DY;
	uint shift = DX & 0x3f;
	uint src = MASK_OUT_ABOVE_8(*r_dst);
	uint res = src >> shift;

	if(shift != 0)
	{
		USE_CYCLES(shift<<CYC_SHIFT);

		if(shift < 8)
		{
			if(GET_MSB_8(src))
				res |= m68ki_shift_8_table[shift];

			*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;

			FLAG_X = FLAG_C = src << (9-shift);
			FLAG_N = NFLAG_8(res);
			FLAG_Z = res;
			FLAG_V = VFLAG_CLEAR;
			return;
		}

		if(GET_MSB_8(src))
		{
			*r_dst |= 0xff;
			FLAG_C = CFLAG_SET;
			FLAG_X = XFLAG_SET;
			FLAG_N = NFLAG_SET;
			FLAG_Z = ZFLAG_CLEAR;
			FLAG_V = VFLAG_CLEAR;
			return;
		}

		*r_dst &= 0xffffff00;
		FLAG_C = CFLAG_CLEAR;
		FLAG_X = XFLAG_CLEAR;
		FLAG_N = NFLAG_CLEAR;
		FLAG_Z = ZFLAG_SET;
		FLAG_V = VFLAG_CLEAR;
		return;
	}

	FLAG_C = CFLAG_CLEAR;
	FLAG_N = NFLAG_8(src);
	FLAG_Z = src;
	FLAG_V = VFLAG_CLEAR;
}